

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_active_later_nolock_(event *ev,int res)

{
  event_base *base;
  void *lock_;
  int iVar1;
  
  base = ev->ev_base;
  lock_ = base->th_base_lock;
  if ((lock_ != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
    iVar1 = evthread_is_debug_lock_held_(lock_);
    if (iVar1 == 0) {
      event_active_later_nolock__cold_1();
    }
  }
  if (((ev->ev_evcallback).evcb_flags & 0x28) != 0) {
    ev->ev_res = ev->ev_res | (ushort)res;
    return;
  }
  ev->ev_res = (ushort)res;
  event_callback_activate_later_nolock_(base,&ev->ev_evcallback);
  return;
}

Assistant:

void
event_active_later_nolock_(struct event *ev, int res)
{
	struct event_base *base = ev->ev_base;
	EVENT_BASE_ASSERT_LOCKED(base);

	if (ev->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) {
		/* We get different kinds of events, add them together */
		ev->ev_res |= res;
		return;
	}

	ev->ev_res = res;

	event_callback_activate_later_nolock_(base, event_to_event_callback(ev));
}